

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fixed-dtoa.cc
# Opt level: O1

void double_conversion::FillFractionals
               (uint64_t fractionals,int exponent,int fractional_count,Vector<char> buffer,
               int *length,int *decimal_point)

{
  int iVar1;
  int iVar2;
  ulong uVar3;
  byte bVar4;
  uint uVar5;
  int iVar6;
  UInt128 *pUVar7;
  int iVar8;
  ulong uVar9;
  int *piVar10;
  ulong uVar11;
  UInt128 local_38;
  
  piVar10 = buffer._8_8_;
  if (exponent < -0x40) {
    local_38.low_bits_ = 0;
    local_38.high_bits_ = fractionals;
    UInt128::Shift(&local_38,-0x40 - exponent);
    if (fractional_count < 1) {
      iVar8 = 0x80;
    }
    else {
      iVar2 = -0x3f;
      iVar6 = 0x80;
      do {
        iVar8 = iVar6;
        if (local_38.high_bits_ == 0 && local_38.low_bits_ == 0) break;
        uVar9 = (local_38.low_bits_ & 0xffffffff) * 5;
        uVar3 = (local_38.low_bits_ >> 0x20) * 5 + (uVar9 >> 0x20);
        local_38.low_bits_ = uVar9 & 0xffffffff | uVar3 << 0x20;
        uVar9 = local_38.high_bits_ * 5 + (uVar3 >> 0x20);
        iVar8 = iVar6 + -1;
        if (iVar6 < 0x41) {
          uVar11 = local_38.low_bits_ >> ((byte)iVar8 & 0x3f);
          uVar3 = (uVar9 << ((byte)iVar2 & 0x3f)) + uVar11;
          local_38.high_bits_ = 0;
          local_38.low_bits_ = local_38.low_bits_ - (uVar11 << ((byte)iVar8 & 0x3f));
        }
        else {
          bVar4 = (char)iVar6 + 0xbf;
          uVar3 = uVar9 >> (bVar4 & 0x3f);
          local_38.high_bits_ = uVar9 - ((long)(int)uVar3 << (bVar4 & 0x3f));
        }
        buffer.start_[*piVar10] = (char)uVar3 + '0';
        *piVar10 = *piVar10 + 1;
        iVar1 = iVar2 - fractional_count;
        iVar2 = iVar2 + 1;
        iVar6 = iVar8;
      } while (iVar1 != -0x40);
    }
    pUVar7 = (UInt128 *)&local_38.low_bits_;
    if (0x40 < iVar8) {
      pUVar7 = &local_38;
    }
    if (((ulong)*(int **)pUVar7 >> ((ulong)(iVar8 - 1) & 0x3f) & 1) != 0) {
      RoundUp(buffer,length,*(int **)pUVar7);
    }
  }
  else {
    uVar9 = (ulong)(uint)-exponent;
    if (0 < fractional_count) {
      do {
        if (fractionals == 0) {
          return;
        }
        uVar5 = (int)uVar9 - 1;
        uVar9 = (ulong)uVar5;
        bVar4 = (byte)uVar5;
        uVar3 = fractionals * 5 >> (bVar4 & 0x3f);
        buffer.start_[*piVar10] = (char)uVar3 + '0';
        *piVar10 = *piVar10 + 1;
        fractionals = fractionals * 5 - ((long)(int)uVar3 << (bVar4 & 0x3f));
        fractional_count = fractional_count + -1;
      } while (fractional_count != 0);
    }
    if ((fractionals != 0) &&
       (bVar4 = (char)uVar9 - 1, (fractionals >> ((ulong)bVar4 & 0x3f) & 1) != 0)) {
      RoundUp(buffer,length,(int *)CONCAT71((int7)(uVar9 >> 8),bVar4));
      return;
    }
  }
  return;
}

Assistant:

static void FillFractionals(uint64_t fractionals, int exponent,
                            int fractional_count, Vector<char> buffer,
                            int* length, int* decimal_point) {
  DOUBLE_CONVERSION_ASSERT(-128 <= exponent && exponent <= 0);
  // 'fractionals' is a fixed-point number, with binary point at bit
  // (-exponent). Inside the function the non-converted remainder of fractionals
  // is a fixed-point number, with binary point at bit 'point'.
  if (-exponent <= 64) {
    // One 64 bit number is sufficient.
    DOUBLE_CONVERSION_ASSERT(fractionals >> 56 == 0);
    int point = -exponent;
    for (int i = 0; i < fractional_count; ++i) {
      if (fractionals == 0) break;
      // Instead of multiplying by 10 we multiply by 5 and adjust the point
      // location. This way the fractionals variable will not overflow.
      // Invariant at the beginning of the loop: fractionals < 2^point.
      // Initially we have: point <= 64 and fractionals < 2^56
      // After each iteration the point is decremented by one.
      // Note that 5^3 = 125 < 128 = 2^7.
      // Therefore three iterations of this loop will not overflow fractionals
      // (even without the subtraction at the end of the loop body). At this
      // time point will satisfy point <= 61 and therefore fractionals < 2^point
      // and any further multiplication of fractionals by 5 will not overflow.
      fractionals *= 5;
      point--;
      int digit = static_cast<int>(fractionals >> point);
      DOUBLE_CONVERSION_ASSERT(digit <= 9);
      buffer[*length] = static_cast<char>('0' + digit);
      (*length)++;
      fractionals -= static_cast<uint64_t>(digit) << point;
    }
    // If the first bit after the point is set we have to round up.
    DOUBLE_CONVERSION_ASSERT(fractionals == 0 || point - 1 >= 0);
    if ((fractionals != 0) && ((fractionals >> (point - 1)) & 1) == 1) {
      RoundUp(buffer, length, decimal_point);
    }
  } else {  // We need 128 bits.
    DOUBLE_CONVERSION_ASSERT(64 < -exponent && -exponent <= 128);
    UInt128 fractionals128 = UInt128(fractionals, 0);
    fractionals128.Shift(-exponent - 64);
    int point = 128;
    for (int i = 0; i < fractional_count; ++i) {
      if (fractionals128.IsZero()) break;
      // As before: instead of multiplying by 10 we multiply by 5 and adjust the
      // point location.
      // This multiplication will not overflow for the same reasons as before.
      fractionals128.Multiply(5);
      point--;
      int digit = fractionals128.DivModPowerOf2(point);
      DOUBLE_CONVERSION_ASSERT(digit <= 9);
      buffer[*length] = static_cast<char>('0' + digit);
      (*length)++;
    }
    if (fractionals128.BitAt(point - 1) == 1) {
      RoundUp(buffer, length, decimal_point);
    }
  }
}